

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O0

Orphan<capnp::DynamicList> * __thiscall
capnp::Orphanage::newOrphan
          (Orphan<capnp::DynamicList> *__return_storage_ptr__,Orphanage *this,ListSchema schema,
          uint size)

{
  BuilderArena *pBVar1;
  CapTableBuilder *pCVar2;
  ListSchema schema_00;
  ListSchema schema_01;
  ElementSize elementSize;
  Which WVar3;
  uint uVar4;
  OrphanBuilder local_b8;
  Orphanage *local_98;
  anon_union_8_2_eba6ea51_for_Type_5 aStack_90;
  Schema local_78;
  StructSize local_6c;
  OrphanBuilder local_68;
  Orphanage *local_48;
  anon_union_8_2_eba6ea51_for_Type_5 aStack_40;
  uint local_2c;
  Orphanage *pOStack_28;
  uint size_local;
  Orphanage *this_local;
  ListSchema schema_local;
  
  schema_local.elementType._0_8_ = schema.elementType.field_4;
  this_local = schema.elementType._0_8_;
  local_2c = size;
  pOStack_28 = this;
  schema_local.elementType.field_4 = (anon_union_8_2_eba6ea51_for_Type_5)__return_storage_ptr__;
  WVar3 = ListSchema::whichElementType((ListSchema *)&this_local);
  if (WVar3 == STRUCT) {
    local_48 = this_local;
    aStack_40 = (anon_union_8_2_eba6ea51_for_Type_5)schema_local.elementType._0_8_;
    pBVar1 = this->arena;
    pCVar2 = this->capTable;
    uVar4 = bounded<unsigned_int>(local_2c);
    local_78.raw = (RawBrandedSchema *)ListSchema::getStructElementType((ListSchema *)&this_local);
    local_6c = anon_unknown_70::structSizeFromSchema((StructSchema)local_78.raw);
    capnp::_::OrphanBuilder::initStructList(&local_68,pBVar1,pCVar2,uVar4,local_6c);
    schema_01.elementType.field_4.schema = aStack_40.schema;
    schema_01.elementType._0_8_ = local_48;
    Orphan<capnp::DynamicList>::Orphan(__return_storage_ptr__,schema_01,&local_68);
    capnp::_::OrphanBuilder::~OrphanBuilder(&local_68);
  }
  else {
    local_98 = this_local;
    aStack_90 = (anon_union_8_2_eba6ea51_for_Type_5)schema_local.elementType._0_8_;
    pBVar1 = this->arena;
    pCVar2 = this->capTable;
    uVar4 = bounded<unsigned_int>(local_2c);
    WVar3 = ListSchema::whichElementType((ListSchema *)&this_local);
    elementSize = anon_unknown_70::elementSizeFor(WVar3);
    capnp::_::OrphanBuilder::initList(&local_b8,pBVar1,pCVar2,uVar4,elementSize);
    schema_00.elementType.field_4.schema = aStack_90.schema;
    schema_00.elementType._0_8_ = local_98;
    Orphan<capnp::DynamicList>::Orphan(__return_storage_ptr__,schema_00,&local_b8);
    capnp::_::OrphanBuilder::~OrphanBuilder(&local_b8);
  }
  return __return_storage_ptr__;
}

Assistant:

Orphan<DynamicList> Orphanage::newOrphan(ListSchema schema, uint size) const {
  if (schema.whichElementType() == schema::Type::STRUCT) {
    return Orphan<DynamicList>(schema, _::OrphanBuilder::initStructList(
        arena, capTable, bounded(size) * ELEMENTS,
        structSizeFromSchema(schema.getStructElementType())));
  } else {
    return Orphan<DynamicList>(schema, _::OrphanBuilder::initList(
        arena, capTable, bounded(size) * ELEMENTS,
        elementSizeFor(schema.whichElementType())));
  }
}